

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O1

Command * __thiscall VkSpecParser::parseCommand(Command *__return_storage_ptr__,VkSpecParser *this)

{
  Data *pDVar1;
  int *piVar2;
  Data *pDVar3;
  qsizetype qVar4;
  QArrayData *pQVar5;
  QString *pQVar6;
  char16_t *pcVar7;
  QArrayData *pQVar8;
  char16_t *pcVar9;
  qsizetype qVar10;
  QArrayData *pQVar11;
  char16_t *pcVar12;
  qsizetype qVar13;
  Data *pDVar14;
  TypedName *pTVar15;
  qsizetype qVar16;
  char cVar17;
  byte bVar18;
  int iVar19;
  QString *data;
  iterator iVar20;
  iterator iVar21;
  pointer pTVar22;
  ulong uVar23;
  long lVar24;
  QXmlStreamAttribute *attr;
  long in_FS_OFFSET;
  QStringView QVar25;
  QStringView QVar26;
  QStringView QVar27;
  QStringView QVar28;
  QStringView QVar29;
  QStringView QVar30;
  QStringView QVar31;
  QStringView QVar32;
  QStringView QVar33;
  undefined1 auVar34 [16];
  QStringView QVar35;
  QArrayData *d;
  QString local_178;
  QArrayDataPointer<QString> local_158;
  QArrayDataPointer<QString> local_138;
  QArrayData *local_118;
  QString *pQStack_110;
  long local_108;
  QArrayData *local_f8;
  char16_t *pcStack_f0;
  qsizetype local_e8;
  QArrayData *pQStack_e0;
  char16_t *local_d8;
  qsizetype qStack_d0;
  QArrayData *local_c8;
  char16_t *pcStack_c0;
  qsizetype local_b8;
  QArrayDataPointer<VkSpecParser::TypedName> QStack_b0;
  ulong local_98;
  TypedName local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98 = 0xaaaaaaaaaaaaaaaa;
  local_f8 = (QArrayData *)0x0;
  pcStack_f0 = (char16_t *)0x0;
  local_e8 = 0;
  pQStack_e0 = (QArrayData *)0x0;
  local_d8 = (char16_t *)0x0;
  qStack_d0 = 0;
  local_c8 = (QArrayData *)0x0;
  pcStack_c0 = (char16_t *)0x0;
  local_b8 = 0;
  QStack_b0.d = (Data *)0x0;
  QStack_b0.ptr = (TypedName *)0x0;
  QStack_b0.size = 0;
  local_118 = (QArrayData *)0x0;
  pQStack_110 = (QString *)0x0;
  local_108 = 0;
  QXmlStreamReader::attributes();
  iVar20 = QList<QXmlStreamAttribute>::begin((QList<QXmlStreamAttribute> *)&local_88);
  iVar21 = QList<QXmlStreamAttribute>::end((QList<QXmlStreamAttribute> *)&local_88);
  if (iVar20.i != iVar21.i) {
    do {
      if ((((iVar20.i)->m_name).m_string.size == 3) &&
         (QVar35.m_data = ((iVar20.i)->m_name).m_string.ptr, QVar35.m_size = 3,
         QVar27.m_data = L"api", QVar27.m_size = 3, cVar17 = QtPrivate::equalStrings(QVar35,QVar27),
         cVar17 != '\0')) {
        QString::QString((QString *)&local_158,(QChar *)((iVar20.i)->m_value).m_string.ptr,
                         ((iVar20.i)->m_value).m_string.size);
        QString::trimmed_helper((QString *)&local_138);
        pQVar6 = pQStack_110;
        pQVar5 = local_118;
        qVar4 = local_138.size;
        pDVar3 = local_138.d;
        local_138.d = (Data *)local_118;
        local_118 = &pDVar3->super_QArrayData;
        pQStack_110 = local_138.ptr;
        local_138.ptr = pQVar6;
        local_138.size = local_108;
        local_108 = qVar4;
        if (pQVar5 != (QArrayData *)0x0) {
          LOCK();
          (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar5,2,0x10);
          }
        }
        if (&(local_158.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_158.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_158.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_158.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_158.d)->super_QArrayData,2,0x10);
          }
        }
      }
      iVar20.i = iVar20.i + 1;
    } while (iVar20.i != iVar21.i);
  }
  QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
            ((QArrayDataPointer<QXmlStreamAttribute> *)&local_88);
  if (local_108 == 0) {
    bVar18 = 0;
  }
  else {
    QString::split(&local_138,&local_118,0x2c,0,1);
    QVar32.m_data = L"vulkan";
    QVar32.m_size = 6;
    bVar18 = QtPrivate::QStringList_contains((QList *)&local_138,QVar32,CaseSensitive);
    bVar18 = bVar18 ^ 1;
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_138);
  }
  if (bVar18 == 0) {
    cVar17 = QXmlStreamReader::atEnd();
    while (cVar17 == '\0') {
      QXmlStreamReader::readNext();
      iVar19 = QXmlStreamReader::tokenType();
      if (iVar19 == 5) {
        auVar34 = QXmlStreamReader::name();
        if ((auVar34._0_8_ == 7) &&
           (QVar25.m_data = auVar34._8_8_, QVar25.m_size = 7, QVar28.m_data = L"command",
           QVar28.m_size = 7, cVar17 = QtPrivate::equalStrings(QVar25,QVar28), cVar17 != '\0'))
        break;
      }
      iVar19 = QXmlStreamReader::tokenType();
      if (iVar19 == 4) {
        local_158.d = (Data *)0x0;
        local_158.ptr = (QString *)0x10b128;
        local_158.size = 5;
        local_178.d.d = (Data *)0x0;
        local_178.d.ptr = L"param";
        local_178.d.size = 5;
        QVar35 = (QStringView)QXmlStreamReader::name();
        if ((QVar35.m_size == local_158.size) &&
           (QVar29.m_data = (storage_type_conflict *)local_158.ptr, QVar29.m_size = local_158.size,
           cVar17 = QtPrivate::equalStrings(QVar35,QVar29), cVar17 != '\0')) {
          parseParamOrProto(&local_88,this,(QString *)&local_158);
          pDVar1 = local_88.typeSuffix.d.d;
          qVar13 = local_b8;
          pcVar12 = pcStack_c0;
          pQVar11 = local_c8;
          qVar10 = qStack_d0;
          pcVar9 = local_d8;
          pQVar8 = pQStack_e0;
          qVar4 = local_e8;
          pcVar7 = pcStack_f0;
          pQVar5 = local_f8;
          local_f8 = &(local_88.name.d.d)->super_QArrayData;
          pcStack_f0 = local_88.name.d.ptr;
          local_88.name.d.d = (Data *)pQVar5;
          local_88.name.d.ptr = pcVar7;
          local_e8 = local_88.name.d.size;
          local_88.name.d.size = qVar4;
          pQStack_e0 = &(local_88.type.d.d)->super_QArrayData;
          local_d8 = local_88.type.d.ptr;
          local_88.type.d.d = (Data *)pQVar8;
          local_88.type.d.ptr = pcVar9;
          qStack_d0 = local_88.type.d.size;
          local_88.type.d.size = qVar10;
          local_88.typeSuffix.d.d = (Data *)local_c8;
          local_c8 = &pDVar1->super_QArrayData;
          pcStack_c0 = local_88.typeSuffix.d.ptr;
          local_88.typeSuffix.d.ptr = pcVar12;
          local_b8 = local_88.typeSuffix.d.size;
          local_88.typeSuffix.d.size = qVar13;
          if (pQVar11 != (QArrayData *)0x0) {
            LOCK();
            (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar11->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar11,2,0x10);
            }
          }
          if (&(local_88.type.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_88.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_88.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 + -1;
            UNLOCK();
            if (((local_88.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                == 0) {
              QArrayData::deallocate(&(local_88.type.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_88.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_88.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_88.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 + -1;
            UNLOCK();
            if (((local_88.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                == 0) {
              QArrayData::deallocate(&(local_88.name.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        else {
          QVar35 = (QStringView)QXmlStreamReader::name();
          if ((QVar35.m_size == local_178.d.size) &&
             (QVar30.m_data = local_178.d.ptr, QVar30.m_size = local_178.d.size,
             cVar17 = QtPrivate::equalStrings(QVar35,QVar30), cVar17 != '\0')) {
            parseParamOrProto(&local_88,this,&local_178);
            QtPrivate::QGenericArrayOps<VkSpecParser::TypedName>::emplace<VkSpecParser::TypedName>
                      ((QGenericArrayOps<VkSpecParser::TypedName> *)&QStack_b0,QStack_b0.size,
                       &local_88);
            QList<VkSpecParser::TypedName>::end((QList<VkSpecParser::TypedName> *)&QStack_b0);
            if (&(local_88.typeSuffix.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_88.typeSuffix.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i = ((local_88.typeSuffix.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((local_88.typeSuffix.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&(local_88.typeSuffix.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (&(local_88.type.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_88.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_88.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                   _M_i + -1;
              UNLOCK();
              if (((local_88.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                  _M_i == 0) {
                QArrayData::deallocate(&(local_88.type.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (&(local_88.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_88.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_88.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                   _M_i + -1;
              UNLOCK();
              if (((local_88.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                  _M_i == 0) {
                QArrayData::deallocate(&(local_88.name.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
          else {
            skip(this);
          }
        }
        if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_158.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_158.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_158.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_158.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_158.d)->super_QArrayData,2,0x10);
          }
        }
      }
      cVar17 = QXmlStreamReader::atEnd();
    }
    local_98 = local_98 & 0xffffffffffffff00;
    if (QStack_b0.size != 0) {
      local_158.size = -0x5555555555555556;
      local_158.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_158.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
      local_88.name.d.d = (Data *)0x0;
      local_88.name.d.ptr = L"VkDevice";
      local_88.name.d.size = 8;
      local_88.type.d.d = (Data *)0x0;
      local_88.type.d.ptr = L"VkQueue";
      local_88.type.d.size = 7;
      local_88.typeSuffix.d.d = (Data *)0x0;
      local_88.typeSuffix.d.ptr = L"VkCommandBuffer";
      local_88.typeSuffix.d.size = 0xf;
      local_178.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_158.ptr =
           (QString *)QArrayData::allocate((QArrayData **)&local_178,0x18,0x10,3,KeepSize);
      local_158.d = (Data *)local_178.d.d;
      local_158.size = 0;
      uVar23 = 0xffffffffffffffe8;
      do {
        pDVar1 = *(Data **)((long)&local_88.type.d.d + uVar23);
        local_158.ptr[local_158.size].d.d = pDVar1;
        local_158.ptr[local_158.size].d.ptr = *(char16_t **)((long)&local_88.type.d.ptr + uVar23);
        local_158.ptr[local_158.size].d.size = *(qsizetype *)((long)&local_88.type.d.size + uVar23);
        if (pDVar1 != (Data *)0x0) {
          LOCK();
          (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_158.size = local_158.size + 1;
        uVar23 = uVar23 + 0x18;
      } while (uVar23 < 0x30);
      lVar24 = 0x30;
      do {
        piVar2 = *(int **)((long)&local_88.name.d.d + lVar24);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            QArrayData::deallocate(*(QArrayData **)((long)&local_88.name.d.d + lVar24),2,0x10);
          }
        }
        lVar24 = lVar24 + -0x18;
      } while (lVar24 != -0x18);
      pTVar22 = QList<VkSpecParser::TypedName>::data((QList<VkSpecParser::TypedName> *)&QStack_b0);
      QVar33.m_data = (pTVar22->type).d.ptr;
      QVar33.m_size = (pTVar22->type).d.size;
      cVar17 = QtPrivate::QStringList_contains((QList *)&local_158,QVar33,CaseSensitive);
      if ((cVar17 != '\0') &&
         ((local_e8 != 0x13 ||
          (QVar26.m_data = pcStack_f0, QVar26.m_size = 0x13, QVar31.m_data = L"vkGetDeviceProcAddr",
          QVar31.m_size = 0x13, cVar17 = QtPrivate::equalStrings(QVar26,QVar31), cVar17 == '\0'))))
      {
        local_98 = CONCAT71(local_98._1_7_,1);
      }
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_158);
    }
    qVar16 = QStack_b0.size;
    pTVar15 = QStack_b0.ptr;
    pDVar14 = QStack_b0.d;
    qVar13 = local_b8;
    pcVar12 = pcStack_c0;
    pQVar11 = local_c8;
    qVar10 = qStack_d0;
    pcVar9 = local_d8;
    pQVar8 = pQStack_e0;
    qVar4 = local_e8;
    pcVar7 = pcStack_f0;
    pQVar5 = local_f8;
    local_f8 = (QArrayData *)0x0;
    pcStack_f0 = (char16_t *)0x0;
    (__return_storage_ptr__->cmd).name.d.d = (Data *)pQVar5;
    (__return_storage_ptr__->cmd).name.d.ptr = pcVar7;
    local_e8 = 0;
    (__return_storage_ptr__->cmd).name.d.size = qVar4;
    pQStack_e0 = (QArrayData *)0x0;
    local_d8 = (char16_t *)0x0;
    (__return_storage_ptr__->cmd).type.d.d = (Data *)pQVar8;
    (__return_storage_ptr__->cmd).type.d.ptr = pcVar9;
    qStack_d0 = 0;
    (__return_storage_ptr__->cmd).type.d.size = qVar10;
    local_c8 = (QArrayData *)0x0;
    pcStack_c0 = (char16_t *)0x0;
    (__return_storage_ptr__->cmd).typeSuffix.d.d = (Data *)pQVar11;
    (__return_storage_ptr__->cmd).typeSuffix.d.ptr = pcVar12;
    local_b8 = 0;
    (__return_storage_ptr__->cmd).typeSuffix.d.size = qVar13;
    QStack_b0.d = (Data *)0x0;
    QStack_b0.ptr = (TypedName *)0x0;
    (__return_storage_ptr__->args).d.d = pDVar14;
    (__return_storage_ptr__->args).d.ptr = pTVar15;
    QStack_b0.size = 0;
    (__return_storage_ptr__->args).d.size = qVar16;
    __return_storage_ptr__->deviceLevel = local_98._0_1_;
  }
  else {
    skip(this);
    (__return_storage_ptr__->args).d.ptr = (TypedName *)0x0;
    (__return_storage_ptr__->args).d.size = 0;
    (__return_storage_ptr__->cmd).typeSuffix.d.size = 0;
    (__return_storage_ptr__->args).d.d = (Data *)0x0;
    (__return_storage_ptr__->cmd).typeSuffix.d.d = (Data *)0x0;
    (__return_storage_ptr__->cmd).typeSuffix.d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->cmd).type.d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->cmd).type.d.size = 0;
    (__return_storage_ptr__->cmd).name.d.size = 0;
    (__return_storage_ptr__->cmd).type.d.d = (Data *)0x0;
    (__return_storage_ptr__->cmd).name.d.d = (Data *)0x0;
    (__return_storage_ptr__->cmd).name.d.ptr = (char16_t *)0x0;
    __return_storage_ptr__->deviceLevel = false;
  }
  if (local_118 != (QArrayData *)0x0) {
    LOCK();
    (local_118->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_118->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_118->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_118,2,0x10);
    }
  }
  QArrayDataPointer<VkSpecParser::TypedName>::~QArrayDataPointer(&QStack_b0);
  if (local_c8 != (QArrayData *)0x0) {
    LOCK();
    (local_c8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_c8,2,0x10);
    }
  }
  if (pQStack_e0 != (QArrayData *)0x0) {
    LOCK();
    (pQStack_e0->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQStack_e0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQStack_e0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQStack_e0,2,0x10);
    }
  }
  if (local_f8 != (QArrayData *)0x0) {
    LOCK();
    (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_f8,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

VkSpecParser::Command VkSpecParser::parseCommand()
{
    Command c;

    // <command successcodes="VK_SUCCESS" ...>
    //   <proto><type>VkResult</type> <name>vkCreateInstance</name></proto>
    //   <param>const <type>VkInstanceCreateInfo</type>* <name>pCreateInfo</name></param>
    //   <param optional="true">const <type>VkAllocationCallbacks</type>* <name>pAllocator</name></param>
    //   <param><type>VkInstance</type>* <name>pInstance</name></param>

    QString api;
    for (const QXmlStreamAttribute &attr : m_reader.attributes()) {
        if (attr.name() == QStringLiteral("api"))
            api = attr.value().toString().trimmed();
    }
    // skip commands with api="vulkansc", but the api attribute is optional
    if (!api.isEmpty() && !api.split(',').contains(QStringLiteral("vulkan"))) {
        skip();
        return {};
    }

    while (!m_reader.atEnd()) {
        m_reader.readNext();
        if (m_reader.isEndElement() && m_reader.name() == QStringLiteral("command"))
            break;
        if (m_reader.isStartElement()) {
            const QString protoStr = QStringLiteral("proto");
            const QString paramStr = QStringLiteral("param");
            if (m_reader.name() == protoStr) {
                c.cmd = parseParamOrProto(protoStr);
            } else if (m_reader.name() == paramStr) {
                c.args.append(parseParamOrProto(paramStr));
            } else {
                skip();
            }
        }
    }

    c.deviceLevel = false;
    if (!c.args.isEmpty()) {
        QStringList dispatchableDeviceAndChildTypes {
            QStringLiteral("VkDevice"),
            QStringLiteral("VkQueue"),
            QStringLiteral("VkCommandBuffer")
        };
        if (dispatchableDeviceAndChildTypes.contains(c.args[0].type)
                && c.cmd.name != QStringLiteral("vkGetDeviceProcAddr"))
        {
            c.deviceLevel = true;
        }
    }

    return c;
}